

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

void PaUtil_SetInterleavedOutputChannels
               (PaUtilBufferProcessor *bp,uint firstChannel,void *data,uint channelCount)

{
  uint in_ECX;
  void *in_RDX;
  int in_ESI;
  PaUtilBufferProcessor *in_RDI;
  uchar *p;
  uint channel;
  uint i;
  void *local_30;
  uint local_20;
  uint local_1c;
  
  local_1c = in_ECX;
  if (in_ECX == 0) {
    local_1c = in_RDI->outputChannelCount;
  }
  local_30 = in_RDX;
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    PaUtil_SetOutputChannel(in_RDI,in_ESI + local_20,local_30,local_1c);
    local_30 = (void *)((long)local_30 + (ulong)in_RDI->bytesPerHostOutputSample);
  }
  return;
}

Assistant:

void PaUtil_SetInterleavedOutputChannels( PaUtilBufferProcessor* bp,
        unsigned int firstChannel, void *data, unsigned int channelCount )
{
    unsigned int i;
    unsigned int channel = firstChannel;
    unsigned char *p = (unsigned char*)data;

    if( channelCount == 0 )
        channelCount = bp->outputChannelCount;

    assert( firstChannel < bp->outputChannelCount );
    assert( firstChannel + channelCount <= bp->outputChannelCount );
    assert( bp->hostOutputIsInterleaved );
    
    for( i=0; i< channelCount; ++i )
    {
        PaUtil_SetOutputChannel( bp, channel + i, p, channelCount );
        p += bp->bytesPerHostOutputSample;
    }
}